

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseDataBase<bool,void(bool_const&)>::
reject<QtPromisePrivate::PromiseError_const&>
          (PromiseDataBase<bool,void(bool_const&)> *this,PromiseError *error)

{
  exception_ptr eStack_18;
  
  std::__exception_ptr::exception_ptr::exception_ptr(&eStack_18,&error->m_data);
  std::__exception_ptr::exception_ptr::operator=((exception_ptr *)(this + 0x50),&eStack_18);
  std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_18);
  PromiseDataBase<bool,_void_(const_bool_&)>::setSettled
            ((PromiseDataBase<bool,_void_(const_bool_&)> *)this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }